

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

size_t __thiscall
andres::
BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
::shape(BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
        *this,size_t j)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_30;
  size_t j_local;
  BinaryViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>,_int,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Times<int,_int,_int>_>
  *this_local;
  
  sVar1 = BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>
          ::dimension(this->e1_);
  sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(this->e2_);
  if (sVar1 < sVar2) {
    local_30 = View<int,_false,_std::allocator<unsigned_long>_>::shape(this->e2_,j);
  }
  else {
    local_30 = BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Times<int,_short,_int>_>
               ::shape(this->e1_,j);
  }
  return local_30;
}

Assistant:

const std::size_t shape(const std::size_t j) const 
        { return e1_.dimension() < e2_.dimension() ? e2_.shape(j) : e1_.shape(j); }